

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O1

void __thiscall sf::Transformable::Transformable(Transformable *this)

{
  this->_vptr_Transformable = (_func_int **)&PTR__Transformable_0022b5d0;
  (this->m_origin).x = 0.0;
  (this->m_origin).y = 0.0;
  (this->m_position).x = 0.0;
  (this->m_position).y = 0.0;
  this->m_rotation = 0.0;
  (this->m_scale).x = 1.0;
  (this->m_scale).y = 1.0;
  Transform::Transform(&this->m_transform);
  this->m_transformNeedUpdate = true;
  Transform::Transform(&this->m_inverseTransform);
  this->m_inverseTransformNeedUpdate = true;
  return;
}

Assistant:

Transformable::Transformable() :
m_origin                    (0, 0),
m_position                  (0, 0),
m_rotation                  (0),
m_scale                     (1, 1),
m_transform                 (),
m_transformNeedUpdate       (true),
m_inverseTransform          (),
m_inverseTransformNeedUpdate(true)
{
}